

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::CheckTargetsForPchCompilePdb(cmGlobalGenerator *this)

{
  pointer puVar1;
  cmLocalGenerator *pcVar2;
  pointer puVar3;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var4;
  cmake *this_00;
  bool bVar5;
  byte bVar6;
  pointer puVar7;
  string *__lhs;
  string *psVar8;
  undefined8 uVar9;
  pointer puVar10;
  allocator<char> local_8e;
  allocator<char> local_8d;
  undefined4 local_8c;
  string e;
  cmValue local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&e,"C",&local_8e);
  bVar5 = GetLanguageEnabled(this,&e);
  if (bVar5) {
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"CXX",&local_8d);
    bVar5 = GetLanguageEnabled(this,(string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&e);
    if (!bVar5) {
      bVar6 = 0;
      goto LAB_0024db5d;
    }
  }
  puVar7 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_8c = 0;
  for (; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pcVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar3 = *(pointer *)
              ((long)&(pcVar2->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    for (puVar10 = *(pointer *)
                    &(pcVar2->GeneratorTargets).
                     super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                     ._M_impl; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      bVar5 = cmGeneratorTarget::CanCompileSources
                        ((cmGeneratorTarget *)
                         (puVar10->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        );
      if (bVar5) {
        _Var4.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t
        .super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
        super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
             (puVar10->_M_t).
             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"ghs_integrity_app",&local_8e);
        local_50 = cmGeneratorTarget::GetProperty
                             ((cmGeneratorTarget *)
                              _Var4.
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,&e);
        bVar5 = cmValue::IsOn(&stack0xffffffffffffffb0);
        std::__cxx11::string::~string((string *)&e);
        if (!bVar5) {
          _Var4.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
          _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
          super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
               (puVar10->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"PRECOMPILE_HEADERS_REUSE_FROM",
                     (allocator<char> *)&stack0xffffffffffffffb0);
          __lhs = cmGeneratorTarget::GetSafeProperty
                            ((cmGeneratorTarget *)
                             _Var4.
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,&e);
          std::__cxx11::string::~string((string *)&e);
          _Var4.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
          _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
          super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
               (puVar10->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"COMPILE_PDB_NAME",(allocator<char> *)&stack0xffffffffffffffb0);
          psVar8 = cmGeneratorTarget::GetSafeProperty
                             ((cmGeneratorTarget *)
                              _Var4.
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,&e);
          std::__cxx11::string::~string((string *)&e);
          if (__lhs->_M_string_length != 0) {
            bVar5 = std::operator!=(__lhs,psVar8);
            if (bVar5) {
              psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  (puVar10->_M_t).
                                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 );
              cmStrCat<char_const(&)[59],std::__cxx11::string_const&,char_const(&)[91],std::__cxx11::string_const&,char_const(&)[3]>
                        (&e,(char (*) [59])
                            "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",psVar8,
                         (char (*) [91])
                         "\"). Reusable precompile headers requires the COMPILE_PDB_NAME property to have the value \""
                         ,__lhs,(char (*) [3])0x75f505);
              this_00 = this->CMakeInstance;
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffb0);
              cmake::IssueMessage(this_00,FATAL_ERROR,&e,
                                  (cmListFileBacktrace *)&stack0xffffffffffffffb0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
              uVar9 = std::__cxx11::string::~string((string *)&e);
              local_8c = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),1);
            }
          }
        }
      }
    }
  }
  bVar6 = (byte)local_8c;
LAB_0024db5d:
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForPchCompilePdb() const
{
  if (!this->GetLanguageEnabled("C") && !this->GetLanguageEnabled("CXX")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      if (!target->CanCompileSources() ||
          target->GetProperty("ghs_integrity_app").IsOn()) {
        continue;
      }

      std::string const& reuseFrom =
        target->GetSafeProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      std::string const& compilePdb =
        target->GetSafeProperty("COMPILE_PDB_NAME");

      if (!reuseFrom.empty() && reuseFrom != compilePdb) {
        const std::string e = cmStrCat(
          "PRECOMPILE_HEADERS_REUSE_FROM property is set on target (\"",
          target->GetName(),
          "\"). Reusable precompile headers requires the COMPILE_PDB_NAME"
          " property to have the value \"",
          reuseFrom, "\"\n");
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e,
                                               target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}